

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

Watcher * __thiscall
efsw::FileWatcherInotify::watcherContainsDirectory(FileWatcherInotify *this,string *dir)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  Watcher *watcher;
  _Self local_80;
  iterator it;
  Lock lock;
  string local_60 [32];
  FileSystem local_40 [8];
  string watcherPath;
  string *dir_local;
  FileWatcherInotify *this_local;
  
  FileSystem::dirRemoveSlashAtEnd(dir);
  std::__cxx11::string::string(local_60,(string *)dir);
  FileSystem::pathRemoveFileName(local_40,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  FileSystem::dirAddSlashAtEnd((string *)local_40);
  Lock::Lock((Lock *)&it,&this->mWatchesLock);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
       ::begin(&this->mWatches);
  while( true ) {
    watcher = (Watcher *)
              std::
              map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
              ::end(&this->mWatches);
    bVar1 = std::operator!=(&local_80,(_Self *)&watcher);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                       (&local_80);
    this_local = (FileWatcherInotify *)ppVar3->second;
    _Var2 = std::operator==(&((Watcher *)&this_local->super_FileWatcherImpl)->Directory,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
    if (_Var2) goto LAB_001181f4;
    std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++(&local_80);
  }
  this_local = (FileWatcherInotify *)0x0;
LAB_001181f4:
  Lock::~Lock((Lock *)&it);
  std::__cxx11::string::~string((string *)local_40);
  return (Watcher *)this_local;
}

Assistant:

Watcher* FileWatcherInotify::watcherContainsDirectory( std::string dir ) {
	FileSystem::dirRemoveSlashAtEnd( dir );
	std::string watcherPath = FileSystem::pathRemoveFileName( dir );
	FileSystem::dirAddSlashAtEnd( watcherPath );
	Lock lock( mWatchesLock );

	for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
		Watcher* watcher = it->second;
		if ( watcher->Directory == watcherPath )
			return watcher;
	}

	return NULL;
}